

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O1

void __thiscall Infector::Container::bindSingleAs<concreteA,IA>(Container *this)

{
  bool bVar1;
  iterator iVar2;
  mapped_type pIVar3;
  mapped_type *ppIVar4;
  undefined8 *puVar5;
  key_type local_20;
  
  bVar1 = resolve_multiple_inheritance_inner<IA>(this,(type_index)0x182d98);
  if (bVar1) {
    local_20._M_target = (type_info *)&concreteA::typeinfo;
    iVar2 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&local_20);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>.
        _M_cur == (__node_type *)0x0) {
      pIVar3 = (mapped_type)operator_new(0x58);
      pIVar3->_vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[1]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[4]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[5]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[8]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[9]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[6]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[7]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[2]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[3]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[10]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3->_vptr_IAnyShared = (_func_int **)&PTR_getPtr_00182df8;
      *(undefined4 *)&pIVar3[1]._vptr_IAnyShared = 0xc0de;
      pIVar3[4]._vptr_IAnyShared = (_func_int **)(pIVar3 + 10);
      pIVar3[5]._vptr_IAnyShared = (_func_int **)0x1;
      *(undefined4 *)&pIVar3[8]._vptr_IAnyShared = 0x3f800000;
      pIVar3[9]._vptr_IAnyShared = (_func_int **)0x0;
      pIVar3[10]._vptr_IAnyShared = (_func_int **)0x0;
      local_20._M_target = (type_info *)&concreteA::typeinfo;
      ppIVar4 = std::__detail::
                _Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this,&local_20);
      *ppIVar4 = pIVar3;
    }
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &PTR__exception_00182990;
  __cxa_throw(puVar5,&ExExistingInterface::typeinfo,std::exception::~exception);
}

Assistant:

void Container::bindSingleAs(){
        bool tests = type_tests<T,Contracts...>(); // Compile time tests.
        (void) tests;  //fix unused variable warning

        bool success = false;
        try{
            success = resolve_multiple_inheritance<T,Contracts...>();
        }catch(std::exception & ex){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            throw ex;
        }catch(...){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            launch_exception<ExUnkownException>();
        }


        if(!success) //no changes.
            launch_exception<ExExistingInterface>();

        try{
            if(singleIstances.find( std::type_index(typeid(T)) )
                                    ==singleIstances.end())
                singleIstances[std::type_index(typeid(T))]
                               = new AnyShared<T,Contracts...>();
        }catch(std::exception & ex){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            throw ex;
        }catch(...){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            launch_exception<ExUnkownException>();
        }
    }